

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t psa_cipher_abort(psa_cipher_operation_t *operation)

{
  psa_status_t pVar1;
  
  pVar1 = 0;
  if ((operation->alg != 0) && (pVar1 = -0x89, (operation->alg & 0x7f000000) == 0x4000000)) {
    mbedtls_cipher_free(&(operation->ctx).cipher);
    operation->alg = 0;
    operation->iv_size = '\0';
    operation->block_size = '\0';
    operation->field_0x4 = operation->field_0x4 & 0xf8;
    pVar1 = 0;
  }
  return pVar1;
}

Assistant:

psa_status_t psa_cipher_abort( psa_cipher_operation_t *operation )
{
    if( operation->alg == 0 )
    {
        /* The object has (apparently) been initialized but it is not
         * in use. It's ok to call abort on such an object, and there's
         * nothing to do. */
        return( PSA_SUCCESS );
    }

    /* Sanity check (shouldn't happen: operation->alg should
     * always have been initialized to a valid value). */
    if( ! PSA_ALG_IS_CIPHER( operation->alg ) )
        return( PSA_ERROR_BAD_STATE );

    mbedtls_cipher_free( &operation->ctx.cipher );

    operation->alg = 0;
    operation->key_set = 0;
    operation->iv_set = 0;
    operation->iv_size = 0;
    operation->block_size = 0;
    operation->iv_required = 0;

    return( PSA_SUCCESS );
}